

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O0

int __thiscall sqlite::Connection::Stmt::bind(Stmt *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  Logic_error *this_00;
  sqlite3 *db;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *pcVar4;
  int status;
  char *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  sqlite3_stmt *sql;
  undefined4 in_stack_ffffffffffffff38;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  sql = this->stmt_;
  iVar1 = bind_parameter_index
                    ((Stmt *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
  this_00 = (Logic_error *)std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::length();
  iVar3 = sqlite3_bind_text(sql,iVar1,this_00,uVar2,0xffffffffffffffff);
  if (iVar3 != 0) {
    db = (sqlite3 *)__cxa_allocate_exception(0x48);
    std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            sqlite3_errmsg(this->db_);
    std::operator+(__lhs,in_stack_ffffffffffffff10);
    pcVar4 = (char *)sqlite3_sql(this->stmt_);
    iVar3 = (int)((ulong)this >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff50,pcVar4,&local_b1);
    Logic_error::Logic_error
              (this_00,(string *)CONCAT44(iVar1,in_stack_ffffffffffffff38),(string *)sql,iVar3,db);
    __cxa_throw(db,&Logic_error::typeinfo,Logic_error::~Logic_error);
  }
  return iVar3;
}

Assistant:

void Connection::Stmt::bind(const std::string & name, const std::string & val)
    {
        int status = sqlite3_bind_text(stmt_, bind_parameter_index(name), val.c_str(), val.length(), SQLITE_TRANSIENT);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error binding " + name +
                ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }